

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomShaderSet
          (anon_unknown_0 *this,Random *rnd,GLSLVersion glslVersion,bool onlyExtensionStages)

{
  NodeType *pNVar1;
  undefined1 *puVar2;
  deBool dVar3;
  int iVar4;
  deUint32 dVar5;
  Node *pNVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *pSVar9;
  bool bVar10;
  float fVar11;
  SharedPtr SVar12;
  Node *local_38;
  
  if ((int)CONCAT71(in_register_00000009,onlyExtensionStages) == 0) {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    if (0.5 <= fVar11) {
      fVar11 = deRandom_getFloat(&rnd->m_rnd);
      if (0.5 <= fVar11) {
        pNVar6 = (Node *)operator_new(0x28);
        pNVar6->m_type = TYPE_PROGRAM;
        (pNVar6->m_enclosingNode).m_ptr = (Node *)0x0;
        (pNVar6->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
        pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
        *(undefined1 *)&pNVar6[1]._vptr_Node = 1;
        local_38 = (Node *)operator_new(0x20);
        local_38->m_type = TYPE_PROGRAM;
        *(undefined4 *)&local_38->field_0xc = 0;
        local_38->_vptr_Node = (_func_int **)&PTR__SharedPtrState_0216b2b8;
        (local_38->m_enclosingNode).m_ptr = pNVar6;
        local_38->m_type = TYPE_SHADER;
        *(undefined4 *)&local_38->field_0xc = 1;
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        puVar7 = (undefined8 *)operator_new(0x28);
        *puVar7 = &PTR__Node_0216b298;
        *(undefined4 *)(puVar7 + 1) = 1;
        puVar7[2] = pNVar6;
        puVar7[3] = local_38;
        LOCK();
        local_38->m_type = local_38->m_type + TYPE_SHADER;
        UNLOCK();
        LOCK();
        *(int *)(puVar7[3] + 0xc) = *(int *)(puVar7[3] + 0xc) + 1;
        UNLOCK();
        *puVar7 = &PTR__Node_0216b2f8;
        *(uint *)(puVar7 + 4) = (uint)(dVar3 != 1);
        *(GLSLVersion *)((long)puVar7 + 0x24) = glslVersion;
        *(undefined8 *)(this + 8) = 0;
        *(undefined8 **)this = puVar7;
        puVar8 = (undefined8 *)operator_new(0x20);
        pSVar9 = extraout_RDX_01;
        goto LAB_01564169;
      }
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->m_type = TYPE_PROGRAM;
      (pNVar6->m_enclosingNode).m_ptr = (Node *)0x0;
      (pNVar6->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
      *(undefined1 *)&pNVar6[1]._vptr_Node = 0;
      local_38 = (Node *)operator_new(0x20);
      local_38->m_type = TYPE_PROGRAM;
      *(undefined4 *)&local_38->field_0xc = 0;
      local_38->_vptr_Node = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      (local_38->m_enclosingNode).m_ptr = pNVar6;
      local_38->m_type = TYPE_SHADER;
      *(undefined4 *)&local_38->field_0xc = 1;
      puVar7 = (undefined8 *)operator_new(0x30);
      *puVar7 = &PTR__Node_0216b298;
      *(undefined4 *)(puVar7 + 1) = 9;
      puVar7[2] = pNVar6;
      puVar7[3] = local_38;
      LOCK();
      local_38->m_type = local_38->m_type + TYPE_SHADER;
      UNLOCK();
      LOCK();
      *(int *)(puVar7[3] + 0xc) = *(int *)(puVar7[3] + 0xc) + 1;
      UNLOCK();
      *puVar7 = &PTR__Node_0216b740;
      *(GLSLVersion *)(puVar7 + 4) = glslVersion;
      *(undefined8 *)((long)puVar7 + 0x24) = 0;
      *(undefined4 *)((long)puVar7 + 0x2c) = 0;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        *(undefined1 *)((long)puVar7 + 0x24) = 1;
        *(undefined1 *)((long)puVar7 + 0x2a) = 1;
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        bVar10 = dVar3 == 1;
      }
      else {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        *(undefined1 *)((long)puVar7 + 0x24) = 1;
        *(bool *)((long)puVar7 + 0x2a) = dVar3 == 1;
        bVar10 = true;
      }
      *(undefined1 *)((long)puVar7 + 0x25) = 1;
      *(bool *)((long)puVar7 + 0x2b) = bVar10;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 **)this = puVar7;
      puVar8 = (undefined8 *)operator_new(0x20);
      pSVar9 = extraout_RDX_02;
      goto LAB_0156422c;
    }
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->m_type = TYPE_PROGRAM;
    (pNVar6->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar6->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
    *(undefined1 *)&pNVar6[1]._vptr_Node = 0;
    local_38 = (Node *)operator_new(0x20);
    local_38->m_type = TYPE_PROGRAM;
    *(undefined4 *)&local_38->field_0xc = 0;
    local_38->_vptr_Node = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    (local_38->m_enclosingNode).m_ptr = pNVar6;
    local_38->m_type = TYPE_SHADER;
    *(undefined4 *)&local_38->field_0xc = 1;
    puVar7 = (undefined8 *)operator_new(0x28);
    *puVar7 = &PTR__Node_0216b298;
    *(undefined4 *)(puVar7 + 1) = 1;
    puVar7[2] = pNVar6;
    puVar7[3] = local_38;
    LOCK();
    local_38->m_type = local_38->m_type + TYPE_SHADER;
    UNLOCK();
    LOCK();
    *(int *)(puVar7[3] + 0xc) = *(int *)(puVar7[3] + 0xc) + 1;
    UNLOCK();
    *puVar7 = &PTR__Node_0216b2f8;
    *(undefined4 *)(puVar7 + 4) = 5;
    *(GLSLVersion *)((long)puVar7 + 0x24) = glslVersion;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 **)this = puVar7;
    puVar8 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar8 + 1) = 0;
    *(undefined4 *)((long)puVar8 + 0xc) = 0;
    *puVar8 = &PTR__SharedPtrState_0216b2b8;
    pSVar9 = extraout_RDX;
  }
  else {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    if (0.5 <= fVar11) {
      pNVar6 = (Node *)operator_new(0x28);
      pNVar6->m_type = TYPE_PROGRAM;
      (pNVar6->m_enclosingNode).m_ptr = (Node *)0x0;
      (pNVar6->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
      pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
      *(undefined1 *)&pNVar6[1]._vptr_Node = 1;
      local_38 = (Node *)operator_new(0x20);
      local_38->m_type = TYPE_PROGRAM;
      *(undefined4 *)&local_38->field_0xc = 0;
      local_38->_vptr_Node = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      (local_38->m_enclosingNode).m_ptr = pNVar6;
      local_38->m_type = TYPE_SHADER;
      *(undefined4 *)&local_38->field_0xc = 1;
      dVar5 = deRandom_getUint32(&rnd->m_rnd);
      puVar7 = (undefined8 *)operator_new(0x28);
      iVar4 = 2;
      if (dVar5 != (dVar5 / 3) * 3) {
        iVar4 = (dVar5 % 3 != 1) + 3;
      }
      *puVar7 = &PTR__Node_0216b298;
      *(undefined4 *)(puVar7 + 1) = 1;
      puVar7[2] = pNVar6;
      puVar7[3] = local_38;
      LOCK();
      local_38->m_type = local_38->m_type + TYPE_SHADER;
      UNLOCK();
      LOCK();
      *(int *)(puVar7[3] + 0xc) = *(int *)(puVar7[3] + 0xc) + 1;
      UNLOCK();
      *puVar7 = &PTR__Node_0216b2f8;
      *(int *)(puVar7 + 4) = iVar4;
      *(GLSLVersion *)((long)puVar7 + 0x24) = glslVersion;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 **)this = puVar7;
      puVar8 = (undefined8 *)operator_new(0x20);
      pSVar9 = extraout_RDX_00;
LAB_01564169:
      *(undefined4 *)(puVar8 + 1) = 0;
      *(undefined4 *)((long)puVar8 + 0xc) = 0;
      *puVar8 = &PTR__SharedPtrState_0216b2b8;
      puVar8[2] = puVar7;
      goto LAB_01564242;
    }
    pNVar6 = (Node *)operator_new(0x28);
    pNVar6->m_type = TYPE_PROGRAM;
    (pNVar6->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar6->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar6->_vptr_Node = (_func_int **)&PTR__Node_0216b250;
    *(undefined1 *)&pNVar6[1]._vptr_Node = 0;
    local_38 = (Node *)operator_new(0x20);
    local_38->m_type = TYPE_PROGRAM;
    *(undefined4 *)&local_38->field_0xc = 0;
    local_38->_vptr_Node = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    (local_38->m_enclosingNode).m_ptr = pNVar6;
    local_38->m_type = TYPE_SHADER;
    *(undefined4 *)&local_38->field_0xc = 1;
    puVar7 = (undefined8 *)operator_new(0x30);
    *puVar7 = &PTR__Node_0216b298;
    *(undefined4 *)(puVar7 + 1) = 9;
    puVar7[2] = pNVar6;
    puVar7[3] = local_38;
    LOCK();
    local_38->m_type = local_38->m_type + TYPE_SHADER;
    UNLOCK();
    LOCK();
    *(int *)(puVar7[3] + 0xc) = *(int *)(puVar7[3] + 0xc) + 1;
    UNLOCK();
    *puVar7 = &PTR__Node_0216b740;
    *(GLSLVersion *)(puVar7 + 4) = glslVersion;
    *(undefined8 *)((long)puVar7 + 0x24) = 0;
    *(undefined4 *)((long)puVar7 + 0x2c) = 0;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    *(undefined1 *)((long)puVar7 + 0x24) = 1;
    *(bool *)((long)puVar7 + 0x2a) = dVar3 == 1;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    *(undefined1 *)((long)puVar7 + 0x25) = 1;
    *(bool *)((long)puVar7 + 0x2b) = dVar3 == 1;
    dVar3 = deRandom_getBool(&rnd->m_rnd);
    if (dVar3 == 1) {
      *(undefined1 *)((long)puVar7 + 0x26) = 1;
      *(undefined1 *)((long)puVar7 + 0x2c) = 1;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        dVar3 = deRandom_getBool(&rnd->m_rnd);
        *(undefined1 *)((long)puVar7 + 0x27) = 1;
        *(bool *)((long)puVar7 + 0x2d) = dVar3 == 1;
        iVar4 = deRandom_getBool(&rnd->m_rnd);
LAB_015641b8:
        bVar10 = iVar4 == 1;
        goto LAB_0156420e;
      }
    }
    else {
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      *(undefined1 *)((long)puVar7 + 0x26) = 1;
      *(bool *)((long)puVar7 + 0x2c) = dVar3 == 1;
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      if (dVar3 == 1) {
        *(undefined1 *)((long)puVar7 + 0x27) = 1;
        *(undefined1 *)((long)puVar7 + 0x2d) = 1;
        iVar4 = deRandom_getBool(&rnd->m_rnd);
        goto LAB_015641b8;
      }
      dVar3 = deRandom_getBool(&rnd->m_rnd);
      *(undefined1 *)((long)puVar7 + 0x27) = 1;
      *(bool *)((long)puVar7 + 0x2d) = dVar3 == 1;
      bVar10 = true;
LAB_0156420e:
      *(undefined1 *)(puVar7 + 5) = 1;
      *(bool *)((long)puVar7 + 0x2e) = bVar10;
    }
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 **)this = puVar7;
    puVar8 = (undefined8 *)operator_new(0x20);
    pSVar9 = extraout_RDX_03;
LAB_0156422c:
    *(undefined4 *)(puVar8 + 1) = 0;
    *(undefined4 *)((long)puVar8 + 0xc) = 0;
    *puVar8 = &PTR__SharedPtrState_0216b2b8;
  }
  puVar8[2] = puVar7;
LAB_01564242:
  *(undefined8 **)(this + 8) = puVar8;
  *(undefined4 *)(puVar8 + 1) = 1;
  *(undefined4 *)((long)puVar8 + 0xc) = 1;
  pNVar6 = local_38;
  if (local_38 != (Node *)0x0) {
    LOCK();
    pNVar1 = &local_38->m_type;
    *pNVar1 = *pNVar1 - TYPE_SHADER;
    UNLOCK();
    if (*pNVar1 == TYPE_PROGRAM) {
      iVar4 = (*local_38->_vptr_Node[2])(local_38);
      pNVar6 = (Node *)CONCAT44(extraout_var,iVar4);
      pSVar9 = extraout_RDX_04;
    }
    LOCK();
    puVar2 = &local_38->field_0xc;
    *(int *)puVar2 = *(int *)puVar2 + -1;
    UNLOCK();
    if ((*(int *)puVar2 == 0) && (local_38 != (Node *)0x0)) {
      iVar4 = (*local_38->_vptr_Node[1])();
      pNVar6 = (Node *)CONCAT44(extraout_var_00,iVar4);
      pSVar9 = extraout_RDX_05;
    }
  }
  SVar12.m_state = pSVar9;
  SVar12.m_ptr = pNVar6;
  return SVar12;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomShaderSet (de::Random& rnd, glu::GLSLVersion glslVersion, bool onlyExtensionStages)
{
	if (!onlyExtensionStages)
		return generateRandomCoreShaderSet(rnd, glslVersion);
	else
		return generateRandomExtShaderSet(rnd, glslVersion);
}